

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text-buffer.cc
# Opt level: O2

void __thiscall TextBuffer::TextBuffer(TextBuffer *this,u16string *text)

{
  pointer pcVar1;
  u16string local_30;
  
  pcVar1 = (text->_M_dataplus)._M_p;
  local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  std::__cxx11::u16string::
  _M_construct<__gnu_cxx::__normal_iterator<char16_t_const*,std::__cxx11::u16string>>
            ((u16string *)&local_30,pcVar1,pcVar1 + text->_M_string_length);
  TextBuffer(this,&local_30);
  std::__cxx11::u16string::~u16string((u16string *)&local_30);
  return;
}

Assistant:

TextBuffer::TextBuffer(const std::u16string &text) :
  TextBuffer{u16string{text.begin(), text.end()}} {}